

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O3

void __thiscall TokenScanner::addOperator(TokenScanner *this,string *op)

{
  StringCell *pSVar1;
  
  pSVar1 = (StringCell *)operator_new(0x28);
  (pSVar1->str)._M_dataplus._M_p = (pointer)&(pSVar1->str).field_2;
  (pSVar1->str)._M_string_length = 0;
  (pSVar1->str).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)pSVar1);
  pSVar1->link = this->operators;
  this->operators = pSVar1;
  return;
}

Assistant:

void TokenScanner::addOperator(string op) {
   StringCell *cp = new StringCell;
   cp->str = op;
   cp->link = operators;
   operators = cp;
}